

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::FuncDecl> __thiscall
mocker::Parser::funcDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  Token *pTVar1;
  size_t sVar2;
  size_t sVar3;
  Position beg;
  Position beg_00;
  Position beg_01;
  bool bVar4;
  TokenID TVar5;
  mapped_type *pmVar6;
  CompileError *pCVar7;
  Token *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  element_type *this_01;
  bool bVar9;
  shared_ptr<mocker::ast::Type> sVar10;
  shared_ptr<mocker::ast::Identifier> sVar11;
  shared_ptr<mocker::ast::FuncDecl> sVar12;
  Position beg_02;
  Position beg_03;
  Position end_00;
  Position end_01;
  shared_ptr<mocker::ast::CompoundStmt> body;
  Parser local_e0;
  element_type *local_c0;
  element_type *local_b8 [2];
  Position local_a8;
  shared_ptr<mocker::ast::Identifier> paramName;
  shared_ptr<mocker::ast::Identifier> ident;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  formalParam;
  element_type *local_58;
  shared_ptr<mocker::ast::Type> retType;
  TokIter local_40;
  TokIter local_38;
  
  this_00 = *end._M_current;
  local_c0 = (element_type *)this;
  sVar10 = type(&local_e0,iter,end);
  _Var8 = sVar10.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_e0.tokBeg._M_current == (Token *)0x0) {
    pTVar1 = *end._M_current;
    *(Token **)end._M_current = pTVar1 + 1;
    if (pTVar1 == in_RCX) {
      TVar5 = Error;
    }
    else {
      TVar5 = Token::tokenID(pTVar1);
      _Var8._M_pi = extraout_RDX;
    }
    if (TVar5 != Void) {
      bVar9 = true;
      bVar4 = false;
      goto LAB_00183dec;
    }
  }
  sVar11 = identifier((Parser *)&local_40,iter,end);
  _Var8 = sVar11.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  bVar4 = true;
  if (local_40._M_current == (Token *)0x0) {
    bVar9 = true;
  }
  else {
    pTVar1 = *end._M_current;
    *(Token **)end._M_current = pTVar1 + 1;
    if (pTVar1 == in_RCX) {
      TVar5 = Error;
    }
    else {
      TVar5 = Token::tokenID(pTVar1);
      _Var8._M_pi = extraout_RDX_00;
    }
    bVar9 = TVar5 != LeftParen;
  }
LAB_00183dec:
  if ((bVar4) && (local_38._M_current != (Token *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_current);
    _Var8._M_pi = extraout_RDX_01;
  }
  if (local_e0.tokEnd._M_current != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0.tokEnd._M_current);
    _Var8._M_pi = extraout_RDX_02;
  }
  *(Token **)end._M_current = this_00;
  if (bVar9) {
    (local_c0->super_Declaration).super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
    (local_c0->super_Declaration).super_ASTNode.super_enable_shared_from_this<mocker::ast::ASTNode>.
    _M_weak_this.super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_01 = local_c0;
  }
  else {
    type((Parser *)&retType,iter,end);
    if (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (*end._M_current == in_RCX) {
        TVar5 = Error;
      }
      else {
        TVar5 = Token::tokenID(*end._M_current);
      }
      if (TVar5 != Void) {
        __assert_fail("id(iter) == TokenID::Void",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x285,
                      "std::shared_ptr<ast::FuncDecl> mocker::Parser::funcDecl(TokIter &, TokIter)")
        ;
      }
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
    }
    identifier((Parser *)&ident,iter,end);
    formalParam.
    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    formalParam.
    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    formalParam.
    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((Token *)(*(long *)end._M_current + 0x38) == in_RCX) {
      TVar5 = Error;
    }
    else {
      TVar5 = Token::tokenID((Token *)(*(long *)end._M_current + 0x38));
    }
    if (TVar5 == RightParen) {
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
    }
    else {
      do {
        *(long *)end._M_current = *(long *)end._M_current + 0x38;
        type((Parser *)&body,iter,end);
        if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
          Token::position(this_00);
          Token::position(*end._M_current);
          beg.col = (size_t)local_e0.tokEnd._M_current;
          beg.line = (size_t)local_e0.tokBeg._M_current;
          CompileError::CompileError(pCVar7,beg,local_a8);
          *(undefined ***)pCVar7 = &PTR__CompileError_001f2a98;
          __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
        }
        identifier((Parser *)&paramName,iter,end);
        if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
          Token::position(this_00);
          Token::position(*end._M_current);
          beg_00.col = (size_t)local_e0.tokEnd._M_current;
          beg_00.line = (size_t)local_e0.tokBeg._M_current;
          CompileError::CompileError(pCVar7,beg_00,local_a8);
          *(undefined ***)pCVar7 = &PTR__CompileError_001f2a98;
          __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
        }
        local_b8[0] = body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)iter[2]._M_current,(key_type *)local_b8);
        sVar2 = (pmVar6->first).line;
        sVar3 = (pmVar6->first).col;
        local_58 = paramName.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)iter[2]._M_current,(key_type *)&local_58);
        beg_02.col = sVar2;
        beg_02.line = (size_t)iter;
        end_00.col = (pmVar6->second).line;
        end_00.line = sVar3;
        makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>>
                  (&local_e0,beg_02,end_00,(shared_ptr<mocker::ast::Type> *)(pmVar6->second).col,
                   (shared_ptr<mocker::ast::Identifier> *)&body);
        std::
        vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
        ::emplace_back<std::shared_ptr<mocker::ast::VarDeclStmt>>
                  ((vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
                    *)&formalParam,(shared_ptr<mocker::ast::VarDeclStmt> *)&local_e0);
        if (local_e0.tokEnd._M_current != (Token *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0.tokEnd._M_current);
        }
        if (paramName.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (paramName.
                     super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (*end._M_current == in_RCX) {
          TVar5 = Error;
        }
        else {
          TVar5 = Token::tokenID(*end._M_current);
        }
      } while (TVar5 == Comma);
    }
    *(long *)end._M_current = *(long *)end._M_current + 0x38;
    compoundStmt((Parser *)&body,iter,end);
    this_01 = local_c0;
    if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
      Token::position(this_00);
      Token::position(*end._M_current);
      beg_01.col = (size_t)local_e0.tokEnd._M_current;
      beg_01.line = (size_t)local_e0.tokBeg._M_current;
      CompileError::CompileError(pCVar7,beg_01,local_a8);
      *(undefined ***)pCVar7 = &PTR__CompileError_001f2a98;
      __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
    }
    Token::position(this_00);
    local_b8[0] = body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)iter[2]._M_current,(key_type *)local_b8);
    beg_03.col = (size_t)local_e0.tokBeg._M_current;
    beg_03.line = (size_t)iter;
    end_01.col = (pmVar6->second).line;
    end_01.line = (size_t)local_e0.tokEnd._M_current;
    makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
              ((Parser *)this_01,beg_03,end_01,(shared_ptr<mocker::ast::Type> *)(pmVar6->second).col
               ,(shared_ptr<mocker::ast::Identifier> *)&retType,
               (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                *)&ident,(shared_ptr<mocker::ast::CompoundStmt> *)&formalParam);
    if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ::~vector(&formalParam);
    _Var8._M_pi = extraout_RDX_03;
    if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var8._M_pi = extraout_RDX_04;
    }
    if (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var8._M_pi = extraout_RDX_05;
    }
  }
  sVar12.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar12.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  return (shared_ptr<mocker::ast::FuncDecl>)
         sVar12.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::FuncDecl> Parser::funcDecl(TokIter &iter, TokIter end) {
  auto beg = iter;
  auto id = GetTokenID(end);
  auto throwError = [beg, &iter] {
    throw SyntaxError(beg->position().first, iter->position().second);
  };

  if (!(type(iter, end) || id(iter++) == TokenID::Void) ||
      !identifier(iter, end) || id(iter++) != TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;
  auto retType = type(iter, end);
  if (!retType) {
    assert(id(iter) == TokenID::Void);
    iter++;
  }
  auto ident = identifier(iter, end);

  std::vector<std::shared_ptr<ast::VarDeclStmt>> formalParam;
  if (id(iter + 1) != TokenID::RightParen) {
    do {
      // Now [iter] points to a Comma or a LeftParen
      ++iter;
      auto ty = type(iter, end);
      if (!ty)
        throwError();
      auto paramName = identifier(iter, end);
      if (!ident)
        throwError();
      formalParam.emplace_back(makeNode<ast::VarDeclStmt>(
          pos[ty->getID()].first, pos[paramName->getID()].second, std::move(ty),
          std::move(paramName)));
    } while (id(iter) == TokenID::Comma);
  } else {
    ++iter;
  }
  ++iter;
  auto body = compoundStmt(iter, end);
  if (!body)
    throwError();
  return makeNode<ast::FuncDecl>(beg->position().first,
                                 pos[body->getID()].second, retType, ident,
                                 std::move(formalParam), body);
}